

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr __thiscall
c4::yml::Parser::_scan_complex_key(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  char *pcVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  ulong uVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  substr sVar14;
  csubstr cVar15;
  ro_substr chars;
  char msg [43];
  substr full;
  csubstr local_128;
  Parser *local_110;
  char *local_108;
  char acStack_100 [32];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined2 local_d8;
  ulong local_d0;
  char *local_c8;
  size_t local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  substr local_40;
  
  sVar12 = currscalar.len;
  pcVar10 = currscalar.str;
  sVar9 = (this->m_buf).len;
  local_128 = peeked_line;
  if (sVar9 == 0) {
    if ((sVar12 == 0) &&
       (pcVar1 = (this->m_buf).str, pcVar8 = pcVar10, pcVar1 == pcVar10 && pcVar1 != (char *)0x0))
    goto LAB_0022c1d2;
  }
  else {
    pcVar8 = (this->m_buf).str;
    if (pcVar8 <= pcVar10 && pcVar10 + sVar12 <= pcVar8 + sVar9) goto LAB_0022c1d2;
  }
  builtin_strncpy(acStack_100 + 0x18,"rrscalar",8);
  uStack_e0 = CONCAT13(uStack_e0._3_1_,0x2929);
  builtin_strncpy(acStack_100 + 8,"_buf.is_super(cu",0x10);
  local_108 = (char *)0x6166206b63656863;
  builtin_strncpy(acStack_100,"iled: (m",8);
  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar2 = (code *)swi(3);
    sVar14 = (substr)(*pcVar2)();
    return sVar14;
  }
  local_68 = 0;
  uStack_60 = 0x75cb;
  local_58 = 0;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_48 = 0x65;
  LVar3.super_LineCol.col = 0;
  LVar3.super_LineCol.offset = SUB168(ZEXT816(0x75cb) << 0x40,0);
  LVar3.super_LineCol.line = SUB168(ZEXT816(0x75cb) << 0x40,8);
  LVar3.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar3.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            ((char *)&local_108,0x2b,LVar3,(this->m_stack).m_callbacks.m_user_data);
  pcVar8 = (this->m_buf).str;
LAB_0022c1d2:
  if (pcVar10 + sVar12 < pcVar8) {
    builtin_strncpy(acStack_100 + 0x18,">= m_buf",8);
    uStack_e0 = 0x6765622e;
    uStack_dc = 0x29286e69;
    builtin_strncpy(acStack_100 + 8,"urrscalar.end() ",0x10);
    local_108 = (char *)0x6166206b63656863;
    builtin_strncpy(acStack_100,"iled: (c",8);
    local_d8 = 0x29;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      sVar14 = (substr)(*pcVar2)();
      return sVar14;
    }
    local_90 = 0;
    uStack_88 = 0x75ce;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x75ce) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x75ce) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_108,0x32,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pcVar8 = (this->m_buf).str;
  }
  local_d0 = (long)(pcVar10 + sVar12) - (long)pcVar8;
  local_110 = this;
  local_c8 = pcVar10;
  local_c0 = sVar12;
  while( true ) {
    if (2 < local_128.len) {
      lVar13 = 0;
      while (local_128.str[lVar13] == "\t..."[lVar13 + 1]) {
        lVar13 = lVar13 + 1;
        if (lVar13 == 3) goto LAB_0022c468;
      }
      lVar13 = 0;
      while (local_128.str[lVar13] == "---"[lVar13]) {
        lVar13 = lVar13 + 1;
        if (lVar13 == 3) goto LAB_0022c468;
      }
    }
    chars.len = 6;
    chars.str = "?:[]{}";
    sVar9 = basic_substring<const_char>::first_of(&local_128,chars,0);
    if (sVar9 != 0xffffffffffffffff) break;
    if (1 < local_128.len) {
      sVar12 = local_128.len - 2;
      sVar9 = 0;
      do {
        lVar13 = 0;
        while( true ) {
          if (local_128.len <= lVar13 + sVar9) {
            _scan_complex_key();
          }
          this = local_110;
          if (local_128.str[lVar13 + sVar9] != "--- "[lVar13 + 2]) break;
          lVar13 = lVar13 + 1;
          if (lVar13 == 2) {
            if (sVar9 != 0xffffffffffffffff) goto LAB_0022c45d;
            goto LAB_0022c389;
          }
        }
        bVar7 = sVar9 != sVar12;
        sVar9 = sVar9 + 1;
      } while (bVar7);
    }
LAB_0022c389:
    cVar15 = _scan_to_next_nonempty_line(this,0);
    uVar11 = cVar15.len;
    pcVar10 = cVar15.str;
    if ((uVar11 == 0) || (pcVar10 == (char *)0x0)) goto LAB_0022c468;
    local_128 = cVar15;
    if (1 < uVar11) {
      sVar9 = 0;
      do {
        lVar13 = 0;
        while( true ) {
          if (local_128.len <= lVar13 + sVar9) {
            _scan_complex_key();
            pcVar10 = local_108;
          }
          this = local_110;
          if (pcVar10[lVar13 + sVar9] != "\": "[lVar13 + 1]) break;
          lVar13 = lVar13 + 1;
          if (lVar13 == 2) {
            if (sVar9 != 0xffffffffffffffff) goto LAB_0022c45d;
            goto LAB_0022c419;
          }
        }
        bVar7 = sVar9 != uVar11 - 2;
        sVar9 = sVar9 + 1;
      } while (bVar7);
    }
LAB_0022c419:
    bVar7 = _advance_to_peeked(this);
    if (!bVar7) goto LAB_0022c468;
    local_128 = (this->m_state->line_contents).rem;
  }
LAB_0022c45d:
  _line_progressed(this,sVar9);
LAB_0022c468:
  sVar9 = local_c0;
  pcVar10 = local_c8;
  uVar6 = local_d0;
  uVar11 = (this->m_state->pos).super_LineCol.offset;
  if (uVar11 < local_d0) {
    builtin_strncpy(acStack_100 + 0x18,"et >= of",8);
    uStack_e0 = 0x297366;
    builtin_strncpy(acStack_100 + 8,"_state->pos.offs",0x10);
    local_108 = (char *)0x6166206b63656863;
    builtin_strncpy(acStack_100,"iled: (m",8);
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      sVar14 = (substr)(*pcVar2)();
      return sVar14;
    }
    local_b8 = 0;
    uStack_b0 = 0x7609;
    local_a8 = 0;
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7609) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7609) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_108,0x2c,LVar5,(this->m_stack).m_callbacks.m_user_data);
    uVar11 = (this->m_state->pos).super_LineCol.offset;
  }
  basic_substring<char>::basic_substring(&local_40,pcVar10,(sVar9 - uVar6) + uVar11);
  return local_40;
}

Assistant:

substr Parser::_scan_complex_key(csubstr currscalar, csubstr peeked_line)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    while(true)
    {
        _c4dbgp("rcplxkey: continuing...");
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rcplxkey: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else
        {
            size_t pos = peeked_line.first_of("?:[]{}");
            if(pos == csubstr::npos)
            {
                pos = peeked_line.find("- ");
            }
            if(pos != csubstr::npos)
            {
                _c4dbgpf("rcplxkey: found special characters at pos={}: '{}'", pos, peeked_line.trimr("\r\n"));
                _line_progressed(pos);
                break;
            }
        }

        _c4dbgpf("rcplxkey: no special chars found '{}'", peeked_line.trimr("\r\n"));
        csubstr next_peeked = _scan_to_next_nonempty_line(0);
        if(next_peeked.empty())
        {
            _c4dbgp("rcplxkey: empty ... finished.");
            break;
        }
        _c4dbgp("rcplxkey: ... continuing.");
        peeked_line = next_peeked;

        _c4dbgpf("rcplxkey: line contents: '{}'", peeked_line.trimr("\r\n"));
        size_t colpos;
        if((colpos = peeked_line.find(": ")) != npos)
        {
            _c4dbgp("rcplxkey: found ': ', stopping.");
            _line_progressed(colpos);
            break;
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        else if((colpos = peeked_line.ends_with(':')))
        {
            _c4dbgp("rcplxkey: ends with ':', stopping.");
            _line_progressed(colpos);
            break;
        }
        #endif
        _c4dbgpf("rcplxkey: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rcplxkey: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    return full;
}